

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall QNetworkReplyImpl::~QNetworkReplyImpl(QNetworkReplyImpl *this)

{
  ~QNetworkReplyImpl(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

QNetworkReplyImpl::~QNetworkReplyImpl()
{
    Q_D(QNetworkReplyImpl);

    // This code removes the data from the cache if it was prematurely aborted.
    // See QNetworkReplyImplPrivate::completeCacheSave(), we disable caching there after the cache
    // save had been properly finished. So if it is still enabled it means we got deleted/aborted.
    if (d->isCachingEnabled())
        d->networkCache()->remove(url());
}